

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aipc.c
# Opt level: O0

void nn_aipc_init(nn_aipc *self,int src,nn_epbase *epbase,nn_fsm *owner)

{
  nn_fsm *owner_local;
  nn_epbase *epbase_local;
  int src_local;
  nn_aipc *self_local;
  
  nn_fsm_init(&self->fsm,nn_aipc_handler,nn_aipc_shutdown,src,self,owner);
  self->state = 1;
  self->epbase = epbase;
  nn_usock_init(&self->usock,1,&self->fsm);
  self->listener = (nn_usock *)0x0;
  (self->listener_owner).src = -1;
  (self->listener_owner).fsm = (nn_fsm *)0x0;
  nn_sipc_init(&self->sipc,2,epbase,&self->fsm);
  nn_fsm_event_init(&self->accepted);
  nn_fsm_event_init(&self->done);
  nn_list_item_init(&self->item);
  return;
}

Assistant:

void nn_aipc_init (struct nn_aipc *self, int src,
    struct nn_epbase *epbase, struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_aipc_handler, nn_aipc_shutdown,
        src, self, owner);
    self->state = NN_AIPC_STATE_IDLE;
    self->epbase = epbase;
    nn_usock_init (&self->usock, NN_AIPC_SRC_USOCK, &self->fsm);
    self->listener = NULL;
    self->listener_owner.src = -1;
    self->listener_owner.fsm = NULL;
    nn_sipc_init (&self->sipc, NN_AIPC_SRC_SIPC, epbase, &self->fsm);
    nn_fsm_event_init (&self->accepted);
    nn_fsm_event_init (&self->done);
    nn_list_item_init (&self->item);
}